

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O2

void Gia_ManInseFindStarting(Gia_Man_t *p,int iPat,Vec_Int_t *vInit,Vec_Int_t *vInputs)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  
  vInit->nSize = 0;
  lVar12 = (long)(iPat >> 5);
  uVar9 = 1 << ((byte)iPat & 0x1f);
  iVar13 = 0;
  while ((iVar13 < p->nRegs &&
         (pGVar7 = Gia_ManCo(p,(iVar13 - p->nRegs) + p->vCos->nSize), pGVar7 != (Gia_Obj_t *)0x0)))
  {
    iVar6 = Gia_ObjId(p,pGVar7);
    uVar3 = p->iData;
    iVar6 = iVar6 * uVar3;
    pvVar4 = p->pData;
    lVar5 = (long)(int)uVar3 * 8 + (long)(iVar6 * 2) * 8;
    uVar8 = 0;
    if (0 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    uVar11 = 0;
    while (uVar8 != uVar11) {
      lVar1 = uVar11 * 8;
      lVar2 = uVar11 * 8;
      uVar11 = uVar11 + 1;
      if ((*(ulong *)((long)pvVar4 + lVar2 + (long)(iVar6 * 2) * 8) &
          *(ulong *)((long)pvVar4 + lVar1 + lVar5)) != 0) {
        __assert_fail("(pData0[i] & pData1[i]) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                      ,0xd1,
                      "void Gia_ManInseFindStarting(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
      }
    }
    iVar10 = 0;
    if ((*(uint *)((long)pvVar4 + lVar12 * 4 + (long)(iVar6 * 2) * 8) & uVar9) == 0) {
      iVar10 = ((*(uint *)((long)pvVar4 + lVar12 * 4 + lVar5) & uVar9) == 0) + 1;
    }
    Vec_IntPush(vInit,iVar10);
    iVar13 = iVar13 + 1;
  }
  iVar13 = 0;
  while( true ) {
    if (p->vCis->nSize - p->nRegs <= iVar13) {
      return;
    }
    pGVar7 = Gia_ManCi(p,iVar13);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    iVar6 = Gia_ObjId(p,pGVar7);
    uVar3 = p->iData;
    iVar6 = iVar6 * uVar3;
    pvVar4 = p->pData;
    lVar5 = (long)(int)uVar3 * 8 + (long)(iVar6 * 2) * 8;
    uVar8 = 0;
    if (0 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    uVar11 = 0;
    while (uVar8 != uVar11) {
      lVar1 = uVar11 * 8;
      lVar2 = uVar11 * 8;
      uVar11 = uVar11 + 1;
      if ((*(ulong *)((long)pvVar4 + lVar2 + (long)(iVar6 * 2) * 8) &
          *(ulong *)((long)pvVar4 + lVar1 + lVar5)) != 0) {
        __assert_fail("(pData0[i] & pData1[i]) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                      ,0xde,
                      "void Gia_ManInseFindStarting(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
      }
    }
    iVar10 = 0;
    if ((*(uint *)((long)pvVar4 + lVar12 * 4 + (long)(iVar6 * 2) * 8) & uVar9) == 0) {
      iVar10 = ((*(uint *)((long)pvVar4 + lVar12 * 4 + lVar5) & uVar9) == 0) + 1;
    }
    Vec_IntPush(vInputs,iVar10);
    iVar13 = iVar13 + 1;
  }
  return;
}

Assistant:

void Gia_ManInseFindStarting( Gia_Man_t * p, int iPat, Vec_Int_t * vInit, Vec_Int_t * vInputs )
{
    Gia_Obj_t * pObj;
    word * pData0, * pData1;
    int i, k;
    Vec_IntClear( vInit );
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            assert( (pData0[i] & pData1[i]) == 0 );
        if ( Abc_InfoHasBit( (unsigned *)pData0, iPat ) )
            Vec_IntPush( vInit, 0 );
        else if ( Abc_InfoHasBit( (unsigned *)pData1, iPat ) )
            Vec_IntPush( vInit, 1 );
        else 
            Vec_IntPush( vInit, 2 );
    }
    Gia_ManForEachPi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            assert( (pData0[i] & pData1[i]) == 0 );
        if ( Abc_InfoHasBit( (unsigned *)pData0, iPat ) )
            Vec_IntPush( vInputs, 0 );
        else if ( Abc_InfoHasBit( (unsigned *)pData1, iPat ) )
            Vec_IntPush( vInputs, 1 );
        else 
            Vec_IntPush( vInputs, 2 );
    }
}